

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O3

void __thiscall
mxx::custom_op<long,true>::custom_op<MxxReduce_GlobalReduce_Test::TestBody()::__0>
          (custom_op<long,true> *this)

{
  undefined8 *puVar1;
  datatype dt;
  int local_34;
  datatype local_30;
  
  *(undefined ***)this = &PTR__custom_op_001a6668;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  this[0x28] = (custom_op<long,true>)0x0;
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = custom_function<MxxReduce_GlobalReduce_Test::TestBody()::__0>;
  *(undefined8 **)(this + 8) = puVar1;
  *(undefined8 *)(this + 0x10) = 0;
  *(code **)(this + 0x18) =
       std::
       _Function_handler<void_(void_*,_void_*,_int_*),_std::_Bind<void_(*((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp:242:47),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp:242:47),_void_*,_void_*,_int_*)>_>
       ::_M_manager;
  *(code **)(this + 0x20) =
       std::
       _Function_handler<void_(void_*,_void_*,_int_*),_std::_Bind<void_(*((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp:242:47),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp:242:47),_void_*,_void_*,_int_*)>_>
       ::_M_invoke;
  local_30._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
  local_30.mpitype = (MPI_Datatype)&ompi_mpi_long;
  local_30.builtin = true;
  MPI_Type_dup(&ompi_mpi_long,this + 0x30);
  local_34 = 0x543;
  attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::set
            ((MPI_Datatype *)(this + 0x30),&local_34,
             (function<void_(void_*,_void_*,_int_*)> *)(this + 8));
  MPI_Op_create(custom_op<long,_true>::mpi_user_function,1,this + 0x38);
  datatype::~datatype(&local_30);
  return;
}

Assistant:

custom_op(Func func) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            using namespace std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                  std::forward<Func>(func), _1, _2, _3);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, IsCommutative, &m_op);
        }
    }